

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.h
# Opt level: O0

string * __thiscall
wabt::IndexToAlphaName_abi_cxx11_(string *__return_storage_ptr__,wabt *this,Index index)

{
  uint uVar1;
  undefined4 local_14;
  Index index_local;
  string *s;
  
  local_14 = (uint)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(char)((ulong)local_14 % 0x1a) + 'a');
    uVar1 = local_14 / 0x1a;
    local_14 = uVar1 - 1;
  } while (uVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string IndexToAlphaName(Index index) {
  std::string s;
  do {
    // For multiple chars, put most frequently changing char first.
    s += 'a' + (index % 26);
    index /= 26;
    // Continue remaining sequence with 'a' rather than 'b'.
  } while (index--);
  return s;
}